

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O1

uintmax_t fs_file_size(string_view path)

{
  string_view path_00;
  uintmax_t uVar1;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  error_code local_50;
  path local_40;
  
  local_50._M_value = 0;
  local_60._M_len = in_RDI;
  local_60._M_str = in_RSI;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_60,auto_format);
  uVar1 = std::filesystem::file_size(&local_40,&local_50);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (local_50._M_value != 0) {
    path_00._M_str = local_60._M_str;
    path_00._M_len = local_60._M_len;
    fname._M_str = "fs_file_size";
    fname._M_len = 0xc;
    fs_print_error(path_00,fname,&local_50);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

std::uintmax_t fs_file_size(std::string_view path)
{
  std::error_code ec;
#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::file_size(path, ec); !ec)  FFS_LIKELY
    return s;
#elif defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getfilesizeex
  if (HANDLE h = CreateFileA(path.data(), GENERIC_READ, FILE_SHARE_READ, nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, nullptr);
      h != INVALID_HANDLE_VALUE)
  {
    LARGE_INTEGER size;
    BOOL ok = GetFileSizeEx(h, &size);

    if (CloseHandle(h) && ok)  FFS_LIKELY
      return size.QuadPart;
  } else {
    ec = std::make_error_code(std::errc::no_such_file_or_directory);
  }
#else

  int r = 0;
#if defined(STATX_SIZE) && defined(USE_STATX)
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_SIZE, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_size;
#endif

  if (r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_size;
  }

#endif

  fs_print_error(path, __func__, ec);
  return {};
}